

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void initMyCard(void)

{
  mapped_type *pmVar1;
  string local_d0;
  int local_ac;
  undefined1 local_a8 [4];
  int i_2;
  int local_84;
  undefined1 local_80 [4];
  int i_1;
  string local_60;
  string local_30;
  int local_c;
  int i;
  
  for (local_c = 1; local_c < 10; local_c = local_c + 1) {
    makeCardName_abi_cxx11_(&local_30,'W',local_c);
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_30);
    *pmVar1 = 0;
    std::__cxx11::string::~string((string *)&local_30);
    makeCardName_abi_cxx11_(&local_60,'B',local_c);
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_60);
    *pmVar1 = 0;
    std::__cxx11::string::~string((string *)&local_60);
    makeCardName_abi_cxx11_((string *)local_80,'T',local_c);
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,(string *)local_80);
    *pmVar1 = 0;
    std::__cxx11::string::~string((string *)local_80);
  }
  for (local_84 = 1; local_84 < 5; local_84 = local_84 + 1) {
    makeCardName_abi_cxx11_((string *)local_a8,'F',local_84);
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,(string *)local_a8);
    *pmVar1 = 0;
    std::__cxx11::string::~string((string *)local_a8);
  }
  for (local_ac = 1; local_ac < 4; local_ac = local_ac + 1) {
    makeCardName_abi_cxx11_(&local_d0,'J',local_ac);
    pmVar1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_d0);
    *pmVar1 = 0;
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void initMyCard() {
    for (int i = 1; i <= 9; i++) {
        my_active_card[makeCardName('W', i)] = 0;
        my_active_card[makeCardName('B', i)] = 0;
        my_active_card[makeCardName('T', i)] = 0;
    }
    for (int i = 1; i <= 4; i++) {
        my_active_card[makeCardName('F', i)] = 0;
    }
    for (int i = 1; i <= 3; i++) {
        my_active_card[makeCardName('J', i)] = 0;
    }
}